

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_send(Curl_easy *data,char *buf,size_t len)

{
  size_t length;
  void *pvVar1;
  char *sendleftovers;
  size_t nsend;
  size_t n;
  MQTT *mq;
  size_t sStack_28;
  CURLcode result;
  size_t len_local;
  char *buf_local;
  Curl_easy *data_local;
  
  mq._4_4_ = 0;
  n = *(size_t *)&(data->req).p;
  sStack_28 = len;
  len_local = (size_t)buf;
  buf_local = (char *)data;
  mq._4_4_ = Curl_xfer_send(data,buf,len,false,&nsend);
  data_local._4_4_ = mq._4_4_;
  if (mq._4_4_ == CURLE_OK) {
    Curl_debug((Curl_easy *)buf_local,CURLINFO_HEADER_OUT,(char *)len_local,nsend);
    if (sStack_28 == nsend) {
      *(undefined8 *)n = 0;
      *(undefined8 *)(n + 8) = 0;
    }
    else {
      length = sStack_28 - nsend;
      pvVar1 = Curl_memdup((void *)(len_local + nsend),length);
      if (pvVar1 == (void *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      *(void **)n = pvVar1;
      *(size_t *)(n + 8) = length;
    }
    data_local._4_4_ = mq._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode mqtt_send(struct Curl_easy *data,
                          char *buf, size_t len)
{
  CURLcode result = CURLE_OK;
  struct MQTT *mq = data->req.p.mqtt;
  size_t n;
  result = Curl_xfer_send(data, buf, len, FALSE, &n);
  if(result)
    return result;
  Curl_debug(data, CURLINFO_HEADER_OUT, buf, (size_t)n);
  if(len != n) {
    size_t nsend = len - n;
    char *sendleftovers = Curl_memdup(&buf[n], nsend);
    if(!sendleftovers)
      return CURLE_OUT_OF_MEMORY;
    mq->sendleftovers = sendleftovers;
    mq->nsend = nsend;
  }
  else {
    mq->sendleftovers = NULL;
    mq->nsend = 0;
  }
  return result;
}